

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

int get_down2_steps(int in_length,int out_length)

{
  int steps;
  
  steps = 0;
  do {
    in_length = in_length + 1 >> 1;
    if (in_length < out_length) {
      return steps;
    }
    steps = steps + 1;
  } while (in_length != 1);
  return steps;
}

Assistant:

static int get_down2_steps(int in_length, int out_length) {
  int steps = 0;
  int proj_in_length;
  while ((proj_in_length = get_down2_length(in_length, 1)) >= out_length) {
    ++steps;
    in_length = proj_in_length;
    if (in_length == 1) {
      // Special case: we break because any further calls to get_down2_length()
      // with be with length == 1, which return 1, resulting in an infinite
      // loop.
      break;
    }
  }
  return steps;
}